

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInFragmentShaderTest
          (CoverageTest *this,Functions *gl)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  string *psVar3;
  MessageBuilder *pMVar4;
  socklen_t __len;
  sockaddr *__addr;
  bool bVar5;
  Functions *pFVar6;
  VertexArrayObject vertex_array_object;
  Framebuffer framebuffer;
  vector<float,_std::allocator<float>_> pixels;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  string fragment_shader;
  string vertex_shader;
  Program program;
  undefined1 local_1a8 [384];
  
  __len = 1;
  pFVar6 = gl;
  Utility::Framebuffer::Framebuffer(&framebuffer,gl,1,1);
  if (framebuffer.m_framebuffer_id == 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Unable to create framebuffer with size [1,1].\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    bVar5 = false;
    goto LAB_00ae8401;
  }
  Utility::Framebuffer::bind(&framebuffer,(int)pFVar6,__addr,__len);
  Utility::Framebuffer::clear(&framebuffer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_shader,m_vertex_shader_code_case_1,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragment_shader,m_fragment_shader_code_case_1,(allocator<char> *)local_1a8);
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Utility::Program::Program(&program,gl,&vertex_shader,&fragment_shader,&local_288);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  if (program.m_program_status.program_id == 0) {
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Program failed to build.\n Vertex Shader:\n");
    pMVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a8,&m_vertex_shader_code_case_1);
    poVar1 = &pMVar4->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nVertex Shader compilation log:\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)&program.m_vertex_shader_status.shader_log);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Fragment Shader:\n");
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&m_fragment_shader_code_case_1);
    poVar1 = &pMVar4->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Fragment Shader compilation log:\n");
    psVar3 = &program.m_fragment_shader_status.shader_log;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar3);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\nWith Program linkage log:\n");
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,(string *)psVar3);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    bVar5 = false;
  }
  else {
    Utility::Program::UseProgram(&program);
    Utility::VertexArrayObject::VertexArrayObject(&vertex_array_object,gl,0);
    Utility::VertexArrayObject::draw(&vertex_array_object,0,1);
    Utility::Framebuffer::readPixels(&pixels,&framebuffer);
    if (pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1a8 + 8));
      std::operator<<((ostream *)(local_1a8 + 8),"ReadPixels error.\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00ae83c4:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1a8 + 8));
      bVar5 = false;
    }
    else {
      bVar5 = true;
      if (this->m_gl_max_clip_distances_value !=
          (int)(long)*pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start) {
        local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1a8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,
                        "Fragment shader\'s gl_MaxClipDistances constant has improper value equal to "
                       );
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<((ostream *)poVar2,"but ");
        pMVar4 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1a8,&this->m_gl_max_clip_distances_value);
        std::operator<<(&(pMVar4->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "is expected. Test failed.");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00ae83c4;
      }
    }
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              (&pixels.super__Vector_base<float,_std::allocator<float>_>);
    Utility::VertexArrayObject::~VertexArrayObject(&vertex_array_object);
  }
  Utility::Program::~Program(&program);
  std::__cxx11::string::~string((string *)&fragment_shader);
  std::__cxx11::string::~string((string *)&vertex_shader);
LAB_00ae8401:
  Utility::Framebuffer::~Framebuffer(&framebuffer);
  return bVar5;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInFragmentShaderTest(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages. In
	 vertex shader setup gl_Position with passed in attribute. Check in
	 fragment shader using "if" statement that gl_MaxClipDistances is equal
	 to GL_MAX_CLIP_DISTANCES passed by uniform. If compared values are not
	 equal, discard the fragment. Output distinguishable color otherwise.
	 Check that the shader program compiles and links successfully. Draw a
	 single GL_POINT with screen centered position attribute and with a
	 configured 1 x 1 pixel size framebuffer. Using glReadPixels function,
	 check that point's fragments were not discarded. */

	/* Creating red-color-only frambuffer. */
	gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, 1, 1);

	if (!framebuffer.isValid())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unable to create framebuffer with size [1,1].\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	framebuffer.bind();
	framebuffer.clear();

	/* Building program. */
	const std::string vertex_shader   = m_vertex_shader_code_case_1;
	const std::string fragment_shader = m_fragment_shader_code_case_1;

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_1 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_1 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Draw test. */
	vertex_array_object.draw(0, 1);

	/* Fetch results. */
	std::vector<glw::GLfloat> pixels = framebuffer.readPixels();

	if (pixels.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ReadPixels error.\n" << tcu::TestLog::EndMessage;
		return false;
	}

	/* Check results. */
	glw::GLuint gl_max_clip_distances_value_in_fragment_shader = glw::GLuint(pixels.front());

	if (gl_max_clip_distances_value_in_fragment_shader != glw::GLuint(m_gl_max_clip_distances_value))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Fragment shader's gl_MaxClipDistances constant has improper value equal to "
						   << gl_max_clip_distances_value_in_fragment_shader << "but " << m_gl_max_clip_distances_value
						   << "is expected. Test failed." << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}